

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

value * __thiscall
mjs::regexp_object::exec(value *__return_storage_ptr__,regexp_object *this,string *str)

{
  uint uVar1;
  bool bVar2;
  regexp_flag rVar3;
  gc_heap *pgVar4;
  ulong uVar5;
  size_type sVar6;
  const_pointer pvVar7;
  gc_string *this_00;
  const_reference pvVar8;
  object *poVar9;
  uint32_t index;
  double dVar10;
  wstring_view wVar11;
  int local_2cc;
  wstring_view local_298;
  string local_288;
  value local_278;
  wstring local_250;
  wstring_view local_230;
  string local_220;
  uint local_20c;
  undefined1 local_208 [4];
  uint32_t i;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  string local_1d0;
  value local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  string local_188;
  gc_heap_ptr<mjs::global_object> local_178;
  undefined1 local_168 [8];
  object_ptr res;
  wstring_view local_148;
  wstring_view local_138;
  regexp local_128;
  undefined1 local_f8 [8];
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> match;
  wchar_t *search_start;
  const_pointer local_c8;
  wchar_t *str_end;
  const_pointer local_b0;
  wchar_t *str_beg;
  value local_98;
  value_representation local_70 [3];
  byte local_51;
  value local_50;
  int local_28;
  byte local_21;
  int32_t start_index;
  bool global;
  string *str_local;
  regexp_object *this_local;
  
  _start_index = str;
  str_local = (string *)this;
  this_local = (regexp_object *)__return_storage_ptr__;
  rVar3 = operator&(this->flags_,global);
  local_21 = rVar3 != none;
  local_51 = 0;
  if ((bool)local_21) {
    pgVar4 = object::heap((object *)this);
    value_representation::get_value(&local_50,&this->last_index_,pgVar4);
    local_51 = 1;
    dVar10 = to_integer(&local_50);
    local_2cc = (int)dVar10;
  }
  else {
    local_2cc = 0;
  }
  if ((local_51 & 1) != 0) {
    value::~value(&local_50);
  }
  local_28 = local_2cc;
  value::value(&local_98,0.0);
  value_representation::value_representation(local_70,&local_98);
  (this->last_index_).repr_ = local_70[0].repr_;
  value::~value(&local_98);
  bVar2 = true;
  if (-1 < local_28) {
    uVar5 = (ulong)local_28;
    _str_beg = string::view(_start_index);
    sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&str_beg);
    bVar2 = sVar6 < uVar5;
  }
  if (bVar2) {
    value::value(__return_storage_ptr__,(value *)value::null);
  }
  else {
    _str_end = string::view(_start_index);
    pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&str_end);
    local_b0 = pvVar7;
    _search_start = string::view(_start_index);
    sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&search_start);
    local_c8 = pvVar7 + sVar6;
    match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(local_b0 + local_28);
    pgVar4 = object::heap((object *)this);
    this_00 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->source_,pgVar4);
    local_138 = gc_string::view(this_00);
    regexp::regexp(&local_128,local_138,this->flags_);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_148,
               (wchar_t *)
               match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)local_c8 -
               (long)match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 2);
    regexp::exec((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)local_f8,
                 &local_128,local_148);
    regexp::~regexp(&local_128);
    bVar2 = std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::empty
                      ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)local_f8);
    if (bVar2) {
      value::value(__return_storage_ptr__,(value *)value::null);
    }
    else {
      if ((local_21 & 1) != 0) {
        pvVar8 = std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::operator[]
                           ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)
                            local_f8,0);
        value_representation::value_representation
                  ((value_representation *)&res.super_gc_heap_ptr_untyped.pos_,
                   (double)((long)pvVar8->second - (long)local_b0 >> 2));
        (this->last_index_).repr_ = res.super_gc_heap_ptr_untyped._8_8_;
      }
      object::heap((object *)this);
      gc_heap_ptr_untracked<mjs::global_object,_true>::track
                ((gc_heap_ptr_untracked<mjs::global_object,_true> *)&local_178,
                 (gc_heap *)&(this->super_native_object).field_0x24);
      make_array((mjs *)local_168,&local_178,0);
      gc_heap_ptr<mjs::global_object>::~gc_heap_ptr(&local_178);
      poVar9 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_168);
      pgVar4 = object::heap((object *)this);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198,"input");
      string::string(&local_188,pgVar4,&local_198);
      value::value(&local_1c0,_start_index);
      (*poVar9->_vptr_object[1])(poVar9,&local_188,&local_1c0,0);
      value::~value(&local_1c0);
      string::~string(&local_188);
      poVar9 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_168);
      pgVar4 = object::heap((object *)this);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"index");
      string::string(&local_1d0,pgVar4,&local_1e0);
      pvVar8 = std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::operator[]
                         ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)local_f8,
                          0);
      value::value((value *)local_208,(double)((long)pvVar8->first - (long)local_b0 >> 2));
      (*poVar9->_vptr_object[1])(poVar9,&local_1d0,local_208,0);
      value::~value((value *)local_208);
      string::~string(&local_1d0);
      local_20c = 0;
      while( true ) {
        uVar1 = local_20c;
        sVar6 = std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::size
                          ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)local_f8
                          );
        if ((uint)sVar6 <= uVar1) break;
        poVar9 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_168);
        pgVar4 = object::heap((object *)this);
        index_string_abi_cxx11_(&local_250,(mjs *)(ulong)local_20c,index);
        wVar11 = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_250);
        local_230 = wVar11;
        string::string(&local_220,pgVar4,&local_230);
        pgVar4 = object::heap((object *)this);
        pvVar8 = std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::operator[]
                           ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)
                            local_f8,(ulong)local_20c);
        wVar11 = regexp_match::str(pvVar8);
        local_298 = wVar11;
        string::string(&local_288,pgVar4,&local_298);
        value::value(&local_278,&local_288);
        (*poVar9->_vptr_object[1])(poVar9,&local_220,&local_278,0);
        value::~value(&local_278);
        string::~string(&local_288);
        string::~string(&local_220);
        std::__cxx11::wstring::~wstring((wstring *)&local_250);
        local_20c = local_20c + 1;
      }
      value::value(__return_storage_ptr__,(object_ptr *)local_168);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_168);
    }
    std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::~vector
              ((vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *)local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

value exec(const string& str) {
        const bool global = (flags_ & regexp_flag::global) != regexp_flag::none;

        const int32_t start_index = global ? static_cast<int32_t>(to_integer(last_index_.get_value(heap()))) : 0;
        last_index_ = value_representation{value{0.0}};
        if (start_index < 0 || static_cast<size_t>(start_index) > str.view().length()) {
            return value::null;
        }

        const wchar_t* const str_beg = str.view().data();
        const wchar_t* const str_end = str_beg + str.view().length();
        const wchar_t* const search_start = str_beg + start_index;

        const auto match = regexp{source_.dereference(heap()).view(), flags_}.exec(std::wstring_view{search_start, static_cast<size_t>(str_end - search_start)});
        if (match.empty()) {
            return value::null;
        }

        if (global) {
            last_index_ = value_representation{static_cast<double>(match[0].second - str_beg)};
        }

        auto res = make_array(global_.track(heap()), 0);

        res->put(string{heap(), "input"}, value{str});
        res->put(string{heap(), "index"}, value{static_cast<double>(match[0].first - str_beg)});

        for (uint32_t i = 0; i < static_cast<uint32_t>(match.size()); ++i) {
            res->put(string{heap(), index_string(i)}, value{string{heap(), match[i].str()}});
        }

        return value{res};
    }